

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::evalSequenceSideEffCase3(ShaderEvalContext *ctx)

{
  int i;
  long lVar1;
  Vector<float,_4> res_2;
  char local_9c [4];
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88 [4];
  Vector<bool,_4> local_78;
  Vector<bool,_4> res_1;
  Vector<int,_4> res_3;
  undefined8 local_58;
  float local_50;
  float local_4c;
  int local_48 [10];
  Vector<int,_4> res;
  Vector<int,_4> res_4;
  
  local_58 = *(undefined8 *)(ctx->in[0].m_data + 1);
  local_50 = ctx->in[0].m_data[3];
  local_4c = ctx->in[0].m_data[0];
  local_78.m_data = (bool  [4])ctx->in[1].m_data[3];
  res_1.m_data = (bool  [4])ctx->in[1].m_data[2];
  res_3.m_data[0] = (int)ctx->in[1].m_data[1];
  res_3.m_data[1] = (int)ctx->in[1].m_data[0];
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  lVar1 = 0;
  do {
    local_48[lVar1] = (int)*(float *)(&local_78)[lVar1].m_data;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_88[0] = ctx->in[2].m_data[0];
  local_88[1] = ctx->in[2].m_data[3];
  local_88[2] = ctx->in[2].m_data[2];
  local_88[3] = ctx->in[2].m_data[1];
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  local_9c[0] = '\0';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  lVar1 = 0;
  do {
    local_9c[lVar1] =
         (float)res.m_data[lVar1 + 2] <= local_88[lVar1] &&
         local_88[lVar1] != (float)res.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_3.m_data[2] = (int)(float)(int)local_9c[0];
  res_3.m_data[3] = (int)(float)(int)local_9c[1];
  local_48[8] = 0;
  local_48[9] = 0;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1 + -2] =
         (int)(*(float *)((long)&local_58 + lVar1 * 4) + (float)res_3.m_data[lVar1 + 2]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_98 = 0;
  uStack_90 = 0;
  lVar1 = 0;
  do {
    *(int *)((long)&local_98 + lVar1 * 4) = (int)(float)res.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  lVar1 = 0;
  do {
    local_48[lVar1 + 4] = *(int *)((long)&local_98 + lVar1 * 4) + local_48[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_98 = 0;
  uStack_90 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_98 + lVar1 * 4) = (float)local_48[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(ctx->color).m_data = local_98;
  *(undefined8 *)((ctx->color).m_data + 2) = uStack_90;
  return;
}

Assistant:

void evalSequenceSideEffCase3	(ShaderEvalContext& ctx) { ctx.color		= sequenceSideEffCase3(ctx.in[0].swizzle(1, 2, 3, 0), ctx.in[1].swizzle(3, 2, 1, 0).asInt(), greaterThan(ctx.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }